

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_array_subdoc(void)

{
  char cVar1;
  int iVar2;
  int __fd;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  bson_t compare;
  bson_t b;
  bson_t subdoc;
  bson_error_t error;
  undefined1 auStack_480 [4];
  uint local_47c;
  undefined1 local_400 [4];
  uint local_3fc;
  undefined1 local_380 [200];
  undefined1 local_2b8 [648];
  
  bson_init(auStack_480);
  bson_init(local_380);
  bson_append_int32(local_380,"a",1,0x7b);
  bson_append_document(auStack_480,"0",1,local_380);
  cVar1 = bson_init_from_json(local_400,"[ { \"a\" : 123 } ]",0xffffffffffffffff,local_2b8);
  if (cVar1 == '\0') goto LAB_001303bb;
  __buf = (void *)bson_get_data(local_400);
  __buf_00 = (void *)bson_get_data(auStack_480);
  if (local_47c == local_3fc) {
    __s1 = (void *)bson_get_data(auStack_480);
    __s2 = (void *)bson_get_data(local_400);
    iVar2 = bcmp(__s1,__s2,(ulong)local_47c);
    if (iVar2 == 0) {
      bson_destroy(auStack_480);
      bson_destroy(local_400);
      return;
    }
  }
  uVar3 = bson_as_canonical_extended_json(local_400,0);
  uVar4 = bson_as_canonical_extended_json(auStack_480,0);
  uVar5 = local_47c;
  if (local_3fc < local_47c) {
    uVar5 = local_3fc;
  }
  if (uVar5 != 0) {
    uVar5 = local_47c;
    if (local_3fc <= local_47c) {
      uVar5 = local_3fc;
    }
    uVar6 = 0;
    do {
      if (*(char *)((long)__buf + uVar6) != *(char *)((long)__buf_00 + uVar6)) {
        uVar6 = uVar6 & 0xffffffff;
        goto LAB_0013030a;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != (uint)uVar6);
  }
  uVar5 = local_3fc;
  if (local_3fc < local_47c) {
    uVar5 = local_47c;
  }
  uVar6 = (ulong)(uVar5 - 1);
LAB_0013030a:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar6,uVar3,uVar4);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
LAB_001303a7:
    test_bson_json_array_subdoc_cold_6();
LAB_001303ac:
    test_bson_json_array_subdoc_cold_5();
LAB_001303b1:
    test_bson_json_array_subdoc_cold_2();
  }
  else {
    if (__fd == -1) goto LAB_001303ac;
    uVar6 = write(iVar2,__buf,(ulong)local_3fc);
    if (uVar6 != local_3fc) goto LAB_001303b1;
    uVar6 = write(__fd,__buf_00,(ulong)local_47c);
    if (uVar6 == local_47c) {
      test_bson_json_array_subdoc_cold_4();
      goto LAB_001303a7;
    }
  }
  test_bson_json_array_subdoc_cold_3();
LAB_001303bb:
  test_bson_json_array_subdoc_cold_1();
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : \"2016-12-13T12:34:56.123Z\" } }",0x158f82db9fb);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:00.000Z\" } }",0);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1969-12-31T16:00:00.000-0800\" } }",0);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+01:00\" } }","Could not parse");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:\" } }",
             "reached end of date while looking for seconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:+01:00\" } }","seconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:00.\" } }",
             "reached end of date while looking for milliseconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.+01:00\" } }",
             "milliseconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"foo-01-01T00:00:00.000Z\" } }","year must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-foo-01T00:00:00.000Z\" } }","month must be an integer"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-fooT00:00:00.000Z\" } }","day must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01Tfoo:00:00.000Z\" } }","hour must be an integer")
  ;
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:foo:00.000Z\" } }",
             "minute must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:foo.000Z\" } }",
             "seconds must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000X\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+1\" } }","could not parse timezone"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+xx00\" } }",
             "could not parse timezone");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+0060\" } }",
             "timezone minute must be at most 59");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-0060\" } }",
             "timezone minute must be at most 59");
  return;
}

Assistant:

static void
test_bson_json_array_subdoc (void)
{
   bson_error_t error;
   const char *json = "[ { \"a\" : 123 } ]";
   bson_t b, compare, subdoc;
   bool r;

   bson_init (&compare);
   bson_init (&subdoc);
   bson_append_int32 (&subdoc, "a", 1, 123);
   bson_append_document (&compare, "0", 1, &subdoc);

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}